

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenStageInfo
          (InstrumentPass *this,uint32_t stage_idx,InstructionBuilder *builder)

{
  allocator<unsigned_int> *this_00;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  pointer puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  reference pvVar4;
  IRContext *pIVar5;
  Instruction *pIVar6;
  allocator<unsigned_int> local_14d;
  uint local_14c;
  iterator local_148;
  size_type local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  uint local_120;
  uint32_t local_11c;
  uint32_t u_3;
  uint32_t launch_id;
  iterator local_110;
  size_type local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  uint local_e4;
  Instruction *pIStack_e0;
  uint32_t u_2;
  Instruction *uint_frag_coord_inst;
  Instruction *frag_coord_inst;
  iterator local_c8;
  size_type local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  uint local_a0;
  uint32_t local_9c;
  uint32_t u_1;
  uint32_t uvec3_cast_id;
  Instruction *uvec3_cast_inst;
  uint32_t local_88;
  uint32_t load_id_4;
  uint32_t load_id_3;
  uint32_t load_id_2;
  iterator local_78;
  size_type local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  uint local_4c;
  uint32_t local_48;
  uint32_t u;
  uint32_t load_id_1;
  uint32_t load_id;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  InstructionBuilder *builder_local;
  uint32_t stage_idx_local;
  InstrumentPass *this_local;
  
  ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)builder;
  load_id = InstructionBuilder::GetUintConstantId(builder,0);
  this_00 = (allocator<unsigned_int> *)((long)&load_id_1 + 3);
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,4,&load_id,this_00);
  std::allocator<unsigned_int>::~allocator(this_00);
  uVar2 = InstructionBuilder::GetUintConstantId
                    ((InstructionBuilder *)
                     ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,stage_idx);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  puVar1 = ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  *pvVar4 = uVar2;
  if (stage_idx == 0) {
    pIVar5 = Pass::context(&this->super_Pass);
    uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,0x2a);
    u = GenVarLoad(this,uVar2,
                   (InstructionBuilder *)
                   ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    uVar2 = GenUintCastCode(this,u,(InstructionBuilder *)
                                   ids.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,1);
    *pvVar4 = uVar2;
    pIVar5 = Pass::context(&this->super_Pass);
    uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,0x2b);
    u = GenVarLoad(this,uVar2,
                   (InstructionBuilder *)
                   ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    uVar2 = GenUintCastCode(this,u,(InstructionBuilder *)
                                   ids.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,2);
    *pvVar4 = uVar2;
  }
  else if (stage_idx == 1) {
    pIVar5 = Pass::context(&this->super_Pass);
    uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,8);
    local_88 = GenVarLoad(this,uVar2,
                          (InstructionBuilder *)
                          ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar2 = GenUintCastCode(this,local_88,
                            (InstructionBuilder *)
                            ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,1);
    *pvVar4 = uVar2;
    pIVar5 = Pass::context(&this->super_Pass);
    uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,7);
    uVar2 = GenVarLoad(this,uVar2,
                       (InstructionBuilder *)
                       ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    local_88 = uVar2;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,2);
    *pvVar4 = uVar2;
  }
  else if (stage_idx == 2) {
    pIVar5 = Pass::context(&this->super_Pass);
    uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,7);
    uVar2 = GenVarLoad(this,uVar2,
                       (InstructionBuilder *)
                       ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    uvec3_cast_inst._4_4_ = uVar2;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,1);
    *pvVar4 = uVar2;
    pIVar5 = Pass::context(&this->super_Pass);
    uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,0xd);
    uvec3_cast_inst._4_4_ =
         GenVarLoad(this,uVar2,
                    (InstructionBuilder *)
                    ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    puVar1 = ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    uVar2 = GetVec3UintId(this);
    _u_1 = InstructionBuilder::AddUnaryOp
                     ((InstructionBuilder *)puVar1,uVar2,OpBitcast,uvec3_cast_inst._4_4_);
    local_9c = Instruction::result_id(_u_1);
    for (local_a0 = 0;
        puVar1 = ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, local_a0 < 2; local_a0 = local_a0 + 1) {
      uVar3 = GetUintId(this);
      uVar2 = local_9c;
      frag_coord_inst._4_4_ = local_a0;
      local_c8 = (iterator)((long)&frag_coord_inst + 4);
      local_c0 = 1;
      std::allocator<unsigned_int>::allocator
                ((allocator<unsigned_int> *)((long)&frag_coord_inst + 3));
      __l_01._M_len = local_c0;
      __l_01._M_array = local_c8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_b8,__l_01,(allocator_type *)((long)&frag_coord_inst + 3));
      pIVar6 = InstructionBuilder::AddCompositeExtract
                         ((InstructionBuilder *)puVar1,uVar3,uVar2,&local_b8);
      uVar2 = Instruction::result_id(pIVar6);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                          (ulong)(local_a0 + 2));
      *pvVar4 = uVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b8);
      std::allocator<unsigned_int>::~allocator
                ((allocator<unsigned_int> *)((long)&frag_coord_inst + 3));
    }
  }
  else if (stage_idx == 3) {
    pIVar5 = Pass::context(&this->super_Pass);
    uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,7);
    uVar2 = GenVarLoad(this,uVar2,
                       (InstructionBuilder *)
                       ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    load_id_4 = uVar2;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,1);
    *pvVar4 = uVar2;
    pIVar5 = Pass::context(&this->super_Pass);
    uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,8);
    load_id_4 = GenVarLoad(this,uVar2,
                           (InstructionBuilder *)
                           ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar2 = GenUintCastCode(this,load_id_4,
                            (InstructionBuilder *)
                            ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,2);
    *pvVar4 = uVar2;
  }
  else if (stage_idx == 4) {
    uVar2 = GetVec4FloatId(this);
    pIVar5 = Pass::context(&this->super_Pass);
    uVar3 = IRContext::GetBuiltinInputVarId(pIVar5,0xf);
    uint_frag_coord_inst = InstructionBuilder::AddLoad((InstructionBuilder *)puVar1,uVar2,uVar3,0);
    puVar1 = ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    uVar2 = GetVec4UintId(this);
    uVar3 = Instruction::result_id(uint_frag_coord_inst);
    pIStack_e0 = InstructionBuilder::AddUnaryOp((InstructionBuilder *)puVar1,uVar2,OpBitcast,uVar3);
    for (local_e4 = 0;
        puVar1 = ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, local_e4 < 2; local_e4 = local_e4 + 1) {
      uVar2 = GetUintId(this);
      uVar3 = Instruction::result_id(pIStack_e0);
      launch_id = local_e4;
      local_110 = &launch_id;
      local_108 = 1;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&u_3 + 3));
      __l_00._M_len = local_108;
      __l_00._M_array = local_110;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_100,__l_00,(allocator_type *)((long)&u_3 + 3));
      pIVar6 = InstructionBuilder::AddCompositeExtract
                         ((InstructionBuilder *)puVar1,uVar2,uVar3,&local_100);
      uVar2 = Instruction::result_id(pIVar6);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                          (ulong)(local_e4 + 1));
      *pvVar4 = uVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_100);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&u_3 + 3));
    }
  }
  else {
    if ((stage_idx != 5) && (1 < stage_idx - 0x1493)) {
      if (stage_idx - 0x14c1 < 6) {
        pIVar5 = Pass::context(&this->super_Pass);
        uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,0x14c7);
        local_11c = GenVarLoad(this,uVar2,
                               (InstructionBuilder *)
                               ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        for (local_120 = 0;
            puVar1 = ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage, local_120 < 3;
            local_120 = local_120 + 1) {
          uVar3 = GetUintId(this);
          uVar2 = local_11c;
          local_14c = local_120;
          local_148 = &local_14c;
          local_140 = 1;
          std::allocator<unsigned_int>::allocator(&local_14d);
          __l._M_len = local_140;
          __l._M_array = local_148;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_138,__l,&local_14d);
          pIVar6 = InstructionBuilder::AddCompositeExtract
                             ((InstructionBuilder *)puVar1,uVar3,uVar2,&local_138);
          uVar2 = Instruction::result_id(pIVar6);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                              (ulong)(local_120 + 1));
          *pvVar4 = uVar2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_138);
          std::allocator<unsigned_int>::~allocator(&local_14d);
        }
        goto LAB_003b24d4;
      }
      if (1 < stage_idx - 0x14f4) {
        __assert_fail("false && \"unsupported stage\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                      ,0x115,
                      "uint32_t spvtools::opt::InstrumentPass::GenStageInfo(uint32_t, InstructionBuilder *)"
                     );
      }
    }
    pIVar5 = Pass::context(&this->super_Pass);
    uVar2 = IRContext::GetBuiltinInputVarId(pIVar5,0x1c);
    local_48 = GenVarLoad(this,uVar2,
                          (InstructionBuilder *)
                          ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    for (local_4c = 0;
        puVar1 = ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, local_4c < 3; local_4c = local_4c + 1) {
      uVar3 = GetUintId(this);
      uVar2 = local_48;
      load_id_2 = local_4c;
      local_78 = &load_id_2;
      local_70 = 1;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&load_id_3 + 3));
      __l_02._M_len = local_70;
      __l_02._M_array = local_78;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_68,__l_02,(allocator_type *)((long)&load_id_3 + 3));
      pIVar6 = InstructionBuilder::AddCompositeExtract
                         ((InstructionBuilder *)puVar1,uVar3,uVar2,&local_68);
      uVar2 = Instruction::result_id(pIVar6);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                          (ulong)(local_4c + 1));
      *pvVar4 = uVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&load_id_3 + 3));
    }
  }
LAB_003b24d4:
  puVar1 = ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  uVar2 = GetVec4UintId(this);
  pIVar6 = InstructionBuilder::AddCompositeConstruct
                     ((InstructionBuilder *)puVar1,uVar2,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  uVar2 = Instruction::result_id(pIVar6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return uVar2;
}

Assistant:

uint32_t InstrumentPass::GenStageInfo(uint32_t stage_idx,
                                      InstructionBuilder* builder) {
  std::vector<uint32_t> ids(4, builder->GetUintConstantId(0));
  ids[0] = builder->GetUintConstantId(stage_idx);
  // %289 = OpCompositeConstruct %v4uint %uint_0 %285 %288 %uint_0
  // TODO(greg-lunarg): Add support for all stages
  switch (spv::ExecutionModel(stage_idx)) {
    case spv::ExecutionModel::Vertex: {
      // Load and store VertexId and InstanceId
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::VertexIndex)),
          builder);
      ids[1] = GenUintCastCode(load_id, builder);

      load_id = GenVarLoad(context()->GetBuiltinInputVarId(
                               uint32_t(spv::BuiltIn::InstanceIndex)),
                           builder);
      ids[2] = GenUintCastCode(load_id, builder);
    } break;
    case spv::ExecutionModel::GLCompute:
    case spv::ExecutionModel::TaskNV:
    case spv::ExecutionModel::MeshNV:
    case spv::ExecutionModel::TaskEXT:
    case spv::ExecutionModel::MeshEXT: {
      // Load and store GlobalInvocationId.
      uint32_t load_id = GenVarLoad(context()->GetBuiltinInputVarId(uint32_t(
                                        spv::BuiltIn::GlobalInvocationId)),
                                    builder);
      for (uint32_t u = 0; u < 3u; ++u) {
        ids[u + 1] = builder->AddCompositeExtract(GetUintId(), load_id, {u})
                         ->result_id();
      }
    } break;
    case spv::ExecutionModel::Geometry: {
      // Load and store PrimitiveId and InvocationId.
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::PrimitiveId)),
          builder);
      ids[1] = load_id;
      load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::InvocationId)),
          builder);
      ids[2] = GenUintCastCode(load_id, builder);
    } break;
    case spv::ExecutionModel::TessellationControl: {
      // Load and store InvocationId and PrimitiveId
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::InvocationId)),
          builder);
      ids[1] = GenUintCastCode(load_id, builder);
      load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::PrimitiveId)),
          builder);
      ids[2] = load_id;
    } break;
    case spv::ExecutionModel::TessellationEvaluation: {
      // Load and store PrimitiveId and TessCoord.uv
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::PrimitiveId)),
          builder);
      ids[1] = load_id;
      load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::TessCoord)),
          builder);
      Instruction* uvec3_cast_inst =
          builder->AddUnaryOp(GetVec3UintId(), spv::Op::OpBitcast, load_id);
      uint32_t uvec3_cast_id = uvec3_cast_inst->result_id();
      for (uint32_t u = 0; u < 2u; ++u) {
        ids[u + 2] =
            builder->AddCompositeExtract(GetUintId(), uvec3_cast_id, {u})
                ->result_id();
      }
    } break;
    case spv::ExecutionModel::Fragment: {
      // Load FragCoord and convert to Uint
      Instruction* frag_coord_inst = builder->AddLoad(
          GetVec4FloatId(),
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::FragCoord)));
      Instruction* uint_frag_coord_inst = builder->AddUnaryOp(
          GetVec4UintId(), spv::Op::OpBitcast, frag_coord_inst->result_id());
      for (uint32_t u = 0; u < 2u; ++u) {
        ids[u + 1] =
            builder
                ->AddCompositeExtract(GetUintId(),
                                      uint_frag_coord_inst->result_id(), {u})
                ->result_id();
      }
    } break;
    case spv::ExecutionModel::RayGenerationNV:
    case spv::ExecutionModel::IntersectionNV:
    case spv::ExecutionModel::AnyHitNV:
    case spv::ExecutionModel::ClosestHitNV:
    case spv::ExecutionModel::MissNV:
    case spv::ExecutionModel::CallableNV: {
      // Load and store LaunchIdNV.
      uint32_t launch_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::LaunchIdNV)),
          builder);
      for (uint32_t u = 0; u < 3u; ++u) {
        ids[u + 1] = builder->AddCompositeExtract(GetUintId(), launch_id, {u})
                         ->result_id();
      }
    } break;
    default: { assert(false && "unsupported stage"); } break;
  }
  return builder->AddCompositeConstruct(GetVec4UintId(), ids)->result_id();
}